

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void mouse_callback(GLFWwindow *window,double xpos,double ypos)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  if (firstMouse) {
    lastX = (float)xpos;
    lastY = (float)ypos;
    firstMouse = false;
  }
  yaw = (float)(xpos - (double)lastX) * 0.5 + yaw;
  fVar7 = (float)((double)lastY - ypos) * 0.5 + pitch;
  fVar6 = 89.0;
  if (fVar7 <= 89.0) {
    fVar6 = fVar7;
  }
  pitch = -89.0;
  if (-89.0 <= fVar6) {
    pitch = fVar6;
  }
  lastX = (float)xpos;
  lastY = (float)ypos;
  dVar1 = cos((double)(yaw * 0.017453292));
  dVar2 = cos((double)(pitch * 0.017453292));
  dVar3 = sin((double)(pitch * 0.017453292));
  dVar4 = sin((double)(yaw * 0.017453292));
  dVar5 = cos((double)(pitch * 0.017453292));
  fVar6 = (float)(dVar5 * dVar4);
  fVar7 = (float)(dVar2 * dVar1);
  fVar8 = (float)dVar3;
  fVar9 = 1.0 / SQRT(fVar8 * fVar8 + fVar7 * fVar7 + fVar6 * fVar6);
  cameraFront.field_0.x = fVar9 * fVar7;
  cameraFront.field_1.y = fVar9 * fVar8;
  cameraFront.field_2.z = fVar9 * fVar6;
  return;
}

Assistant:

static void mouse_callback(GLFWwindow* window, double xpos, double ypos){
    if(firstMouse){
        lastX = xpos;
        lastY = ypos;
        firstMouse = false;
    }
    float xOffset = xpos - lastX;
    float yOffset = lastY - ypos;//注意这个
    lastX = xpos;
    lastY = ypos;
    float sensitivity = 0.5;
    xOffset *= sensitivity;
    yOffset *= sensitivity;
    yaw   += xOffset;
    pitch += yOffset;
    if(pitch > 89.0f)
        pitch = 89.0f;
    if(pitch < -89.0f)
        pitch = -89.0f;
    glm::vec3 front;
    front.x = cos(glm::radians(yaw)) * cos(glm::radians(pitch));
    front.y = sin(glm::radians(pitch));
    front.z = sin(glm::radians(yaw)) * cos(glm::radians(pitch));
    cameraFront = glm::normalize(front);
}